

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,char (*arg) [13],unsigned_long *arg_1)

{
  Arg *in_R9;
  string_view format_00;
  Arg local_d8;
  Arg local_a8;
  lts_20240722 *local_78;
  char *pcStack_70;
  string local_60;
  string_view local_40;
  unsigned_long *local_30;
  unsigned_long *arg_local_1;
  char (*arg_local) [13];
  Output *this_local;
  string_view format_local;
  
  pcStack_70 = format._M_str;
  local_78 = (lts_20240722 *)format._M_len;
  local_30 = arg_1;
  arg_local_1 = (unsigned_long *)arg;
  arg_local = (char (*) [13])this;
  this_local = (Output *)local_78;
  format_local._M_len = (size_t)pcStack_70;
  absl::lts_20240722::substitute_internal::Arg::Arg(&local_a8,*arg);
  absl::lts_20240722::substitute_internal::Arg::Arg(&local_d8,*local_30);
  format_00._M_str = (char *)&local_a8;
  format_00._M_len = (size_t)pcStack_70;
  absl::lts_20240722::Substitute_abi_cxx11_(&local_60,local_78,format_00,&local_d8,in_R9);
  local_40 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
  Write(this,local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }